

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O0

void rw::d3d9::instance(ObjPipeline *rwpipe,Atomic *atomic)

{
  Geometry *geometry;
  InstanceDataHeader *pIVar1;
  InstanceDataHeader *header;
  Geometry *geo;
  ObjPipeline *pipe;
  Atomic *atomic_local;
  ObjPipeline *rwpipe_local;
  
  geometry = atomic->geometry;
  if ((geometry->flags & 0x1000000) == 0) {
    if ((geometry->instData != (InstanceDataHeader *)0x0) &&
       (geometry->instData[1].platform != (uint)geometry->meshHeader->serialNum)) {
      freeInstanceData(geometry);
    }
    if (geometry->instData == (InstanceDataHeader *)0x0) {
      pIVar1 = instanceMesh(rwpipe,geometry);
      geometry->instData = &pIVar1->super_InstanceDataHeader;
      (**(code **)&rwpipe[1].super_Pipeline)(geometry,geometry->instData,0);
    }
    else if (geometry->lockedSinceInst != 0) {
      (**(code **)&rwpipe[1].super_Pipeline)(geometry,geometry->instData,1);
    }
    geometry->lockedSinceInst = 0;
  }
  return;
}

Assistant:

static void
instance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	// don't try to (re)instance native data
	if(geo->flags & Geometry::NATIVE)
		return;

	InstanceDataHeader *header = (InstanceDataHeader*)geo->instData;
	if(geo->instData){
		// Already have instanced data, so check if we have to reinstance
		assert(header->platform == PLATFORM_D3D9);
		if(header->serialNumber != geo->meshHeader->serialNum){
			// Mesh changed, so reinstance everything
			freeInstanceData(geo);
		}
	}

	// no instance or complete reinstance
	if(geo->instData == nil){
		geo->instData = instanceMesh(rwpipe, geo);
		pipe->instanceCB(geo, (InstanceDataHeader*)geo->instData, 0);
	}else if(geo->lockedSinceInst)
		pipe->instanceCB(geo, (InstanceDataHeader*)geo->instData, 1);

	geo->lockedSinceInst = 0;
}